

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O3

void __thiscall AMorphProjectile::Serialize(AMorphProjectile *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar4;
  PClassActor **ppPVar5;
  PClassActor **ppPVar6;
  PClass *pPVar3;
  
  AActor::Serialize(&this->super_AActor,arc);
  pPVar3 = (this->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
  }
  pBVar1 = pPVar3->Defaults;
  ppPVar6 = (PClassActor **)0x0;
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4c0);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  pFVar4 = Serialize<PClassActor>(arc,"playerclass",(PClassActor **)&this->PlayerClass,ppPVar5);
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4c8);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  pFVar4 = Serialize<PClassActor>(pFVar4,"monsterclass",&this->MonsterClass,ppPVar5);
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4e0);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"duration",&this->Duration,(int32_t *)ppPVar5);
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4e4);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"morphstyle",&this->MorphStyle,(int32_t *)ppPVar5);
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4d0);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  pFVar4 = Serialize<PClassActor>(pFVar4,"morphflash",&this->MorphFlash,ppPVar5);
  ppPVar5 = (PClassActor **)(pBVar1 + 0x4d8);
  if (save_full != false) {
    ppPVar5 = ppPVar6;
  }
  Serialize<PClassActor>(pFVar4,"unmorphflash",&this->UnMorphFlash,ppPVar5);
  return;
}

Assistant:

void AMorphProjectile::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (AMorphProjectile*)GetDefault();
	arc("playerclass", PlayerClass, def->PlayerClass)
		("monsterclass", MonsterClass, def->MonsterClass)
		("duration", Duration, def->Duration)
		("morphstyle", MorphStyle, def->MorphStyle)
		("morphflash", MorphFlash, def->MorphFlash)
		("unmorphflash", UnMorphFlash, def->UnMorphFlash);
}